

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O1

char * __thiscall
Imf_3_4::anon_unknown_75::MemAttrStream::readMemoryMapped(MemAttrStream *this,int n)

{
  ulong uVar1;
  InputExc *this_00;
  
  uVar1 = this->_pos;
  if (uVar1 < this->_sz) {
    if ((long)n + uVar1 <= this->_sz) {
      this->_pos = (long)n + uVar1;
      return this->_data + uVar1;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"Reading past end of file.");
  }
  else {
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this_00,"Unexpected end of file.");
  }
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

char*    readMemoryMapped (int n) override
    {
        if (_pos >= _sz)
            throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

        if (_pos + n > _sz)
            throw IEX_NAMESPACE::InputExc ("Reading past end of file.");

        char* retVal = _data + _pos;
        _pos += n;
        return retVal;
    }